

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
             *this,char **it)

{
  int iVar1;
  size_t __n;
  char *__dest;
  size_t __n_00;
  bool bVar2;
  byte *pbVar3;
  uint uVar4;
  char *__s;
  char *pcVar5;
  size_t __len;
  ptrdiff_t _Num;
  
  __n = *(size_t *)(this + 0x10);
  __dest = *it;
  __s = __dest;
  if (__n != 0) {
    memmove(__dest,*(void **)(this + 8),__n);
    __s = __dest + __n;
    *it = __s;
  }
  __n_00 = *(size_t *)(this + 0x20);
  pcVar5 = __s;
  if (__n_00 != 0) {
    pcVar5 = __s + __n_00;
    memset(__s,*(int *)(this + 0x18),__n_00);
  }
  iVar1 = *(int *)(this + 0x2c);
  pbVar3 = (byte *)(__dest + __n_00 + __n + (long)iVar1);
  uVar4 = *(uint *)(this + 0x28);
  do {
    pbVar3 = pbVar3 + -1;
    *pbVar3 = (byte)uVar4 & 1 | 0x30;
    bVar2 = 1 < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  *it = pcVar5 + iVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }